

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve-names.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_16::NameResolver::BeginTryTableExpr(NameResolver *this,TryTableExpr *expr)

{
  bool bVar1;
  reference this_00;
  TableCatch *catch_;
  iterator __end1;
  iterator __begin1;
  TryTableVector *__range1;
  TryTableExpr *expr_local;
  NameResolver *this_local;
  
  __end1 = std::vector<wabt::TableCatch,_std::allocator<wabt::TableCatch>_>::begin(&expr->catches);
  catch_ = (TableCatch *)
           std::vector<wabt::TableCatch,_std::allocator<wabt::TableCatch>_>::end(&expr->catches);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<wabt::TableCatch_*,_std::vector<wabt::TableCatch,_std::allocator<wabt::TableCatch>_>_>
                                *)&catch_);
    if (!bVar1) break;
    this_00 = __gnu_cxx::
              __normal_iterator<wabt::TableCatch_*,_std::vector<wabt::TableCatch,_std::allocator<wabt::TableCatch>_>_>
              ::operator*(&__end1);
    bVar1 = TableCatch::IsCatchAll(this_00);
    if (!bVar1) {
      ResolveTagVar(this,&this_00->tag);
    }
    ResolveLabelVar(this,&this_00->target);
    __gnu_cxx::
    __normal_iterator<wabt::TableCatch_*,_std::vector<wabt::TableCatch,_std::allocator<wabt::TableCatch>_>_>
    ::operator++(&__end1);
  }
  PushLabel(this,&(expr->block).label);
  ResolveBlockDeclarationVar(this,&(expr->block).decl);
  Result::Result((Result *)((long)&this_local + 4),Ok);
  return (Result)this_local._4_4_;
}

Assistant:

Result NameResolver::BeginTryTableExpr(TryTableExpr* expr) {
  for (TableCatch& catch_ : expr->catches) {
    if (!catch_.IsCatchAll()) {
      ResolveTagVar(&catch_.tag);
    }
    ResolveLabelVar(&catch_.target);
  }
  PushLabel(expr->block.label);
  ResolveBlockDeclarationVar(&expr->block.decl);
  return Result::Ok;
}